

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int m_get_rsi_resumable(aec_stream *strm)

{
  uint8_t uVar1;
  internal_state *state;
  uint32_t *puVar2;
  uint8_t *puVar3;
  size_t sVar4;
  uint32_t uVar5;
  uint uVar6;
  
  state = strm->state;
  do {
    if (strm->avail_in < (ulong)state->bytes_per_sample) {
      if (state->flush != 1) {
        return 0;
      }
      uVar5 = state->i;
      if (uVar5 == 0) {
        emit(state,0,state->bits);
        sVar4 = strm->avail_out;
        if (sVar4 == 0) {
          return 0;
        }
        if (state->direct_out == 0) {
          uVar1 = *state->cds;
          puVar3 = strm->next_out;
          strm->next_out = puVar3 + 1;
          *puVar3 = uVar1;
          sVar4 = strm->avail_out;
        }
        strm->avail_out = sVar4 - 1;
        state->flushed = 1;
        return 0;
      }
      state->blocks_avail = uVar5 / strm->block_size - (uint)(uVar5 % strm->block_size == 0);
      puVar2 = state->data_raw;
      do {
        puVar2[uVar5] = puVar2[uVar5 - 1];
        uVar5 = state->i + 1;
        state->i = uVar5;
        uVar6 = strm->block_size * strm->rsi;
      } while (uVar5 < uVar6);
    }
    else {
      uVar5 = (*state->get_sample)(strm);
      state->data_raw[state->i] = uVar5;
      uVar5 = state->i;
      uVar6 = strm->block_size * strm->rsi;
    }
    state->i = uVar5 + 1;
    if (uVar6 <= uVar5 + 1) {
      if ((strm->flags & 8) != 0) {
        (*state->preprocess)(strm);
      }
      m_check_zero_block(strm);
      return 1;
    }
  } while( true );
}

Assistant:

static int m_get_rsi_resumable(struct aec_stream *strm)
{
    /**
       Get RSI while input buffer is short.

       Let user provide more input. Once we got all input pad buffer
       to full RSI.
    */

    struct internal_state *state = strm->state;

    do {
        if (strm->avail_in >= state->bytes_per_sample) {
            state->data_raw[state->i] = state->get_sample(strm);
        } else {
            if (state->flush == AEC_FLUSH) {
                if (state->i > 0) {
                    state->blocks_avail = state->i / strm->block_size - 1;
                    if (state->i % strm->block_size)
                        state->blocks_avail++;
                    do
                        state->data_raw[state->i] =
                            state->data_raw[state->i - 1];
                    while(++state->i < strm->rsi * strm->block_size);
                } else {
                    /* Finish encoding by padding the last byte with
                     * zero bits. */
                    emit(state, 0, state->bits);
                    if (strm->avail_out > 0) {
                        if (!state->direct_out)
                            *strm->next_out++ = *state->cds;
                        strm->avail_out--;
                        state->flushed = 1;
                    }
                    return M_EXIT;
                }
            } else {
                return M_EXIT;
            }
        }
    } while (++state->i < strm->rsi * strm->block_size);

    if (strm->flags & AEC_DATA_PREPROCESS)
        state->preprocess(strm);

    return m_check_zero_block(strm);
}